

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

bool __thiscall
glslang::TGlslIoMapper::doMap(TGlslIoMapper *this,TIoMapResolver *resolver,TInfoSink *infoSink)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *this_00;
  anon_class_16_2_e2dc3bb0 __f;
  bool bVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  pointer *ppTVar8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar9;
  size_type sVar10;
  pointer ppVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermNode *pTVar12;
  anon_class_16_2_48d7001c __f_00;
  anon_class_16_2_392509e7 __f_01;
  anon_class_16_2_f88403eb __f_02;
  anon_class_16_2_f88403eb __f_03;
  pointer *local_938;
  pointer *local_920;
  pointer *local_908;
  pointer *local_8f0;
  undefined1 local_8e0 [8];
  TVarSetTraverser iter_iomap;
  TVarLiveMap **pUniformVarMap_1;
  size_t stage_2;
  int local_798;
  int local_794;
  int stride;
  int size;
  TType *t;
  TQualifier *qualifier;
  _Self local_778;
  iterator at;
  TVarLiveMap **pUniformVarMap;
  size_t stage_1;
  bool upgraded;
  TVarLivePair *var_6;
  iterator __end2_1;
  iterator __begin2_1;
  TVarLiveVector *__range2_1;
  TVarLivePair *var_5;
  iterator __end2;
  iterator __begin2;
  TVarLiveVector *__range2;
  TVarLivePair local_6f0;
  reference local_698;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *var_4;
  iterator __end4_4;
  iterator __begin4_4;
  TVarLiveMap *__range4_4;
  TVarLivePair *var_3;
  iterator __end4_3;
  iterator __begin4_3;
  TVarLiveVector *__range4_3;
  TVarLivePair *var_2;
  iterator __end4_2;
  iterator __begin4_2;
  TVarLiveVector *__range4_2;
  TVarLivePair *var_1;
  iterator __end4_1;
  iterator __begin4_1;
  TVarLiveVector *__range4_1;
  TVarLivePair *var;
  iterator __end4;
  iterator __begin4;
  TVarLiveVector *__range4;
  EShLanguage local_504;
  undefined1 local_500 [4];
  int stage;
  TVarLiveVector uniformVector;
  TVarLiveVector outVectors [14];
  TVarLiveVector inVectors [14];
  TSymbolValidater symbolValidater;
  TResolverInOutAdaptor inOutResolve;
  TResolverUniformAdaptor uniformResolve;
  TInfoSink *infoSink_local;
  TIoMapResolver *resolver_local;
  TGlslIoMapper *this_local;
  
  uniformResolve.uniformVarMap[0xd] = (TVarLiveMap *)infoSink;
  (*resolver->_vptr_TIoMapResolver[0xf])(resolver,0xe);
  if ((this->hadError & 1U) == 0) {
    TResolverUniformAdaptor::TResolverUniformAdaptor
              ((TResolverUniformAdaptor *)&inOutResolve.error,EShLangCount,resolver,
               this->uniformVarMap,(TInfoSink *)uniformResolve.uniformVarMap[0xd],&this->hadError);
    TResolverInOutAdaptor::TResolverInOutAdaptor
              ((TResolverInOutAdaptor *)&symbolValidater.profile,EShLangCount,resolver,
               (TInfoSink *)uniformResolve.uniformVarMap[0xd],&this->hadError);
    TSymbolValidater::TSymbolValidater
              ((TSymbolValidater *)
               &inVectors[0xd].
                super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,resolver,
               (TInfoSink *)uniformResolve.uniformVarMap[0xd],this->inVarMaps,this->outVarMaps,
               this->uniformVarMap,&this->hadError,this->profile,this->version);
    local_8f0 = &outVectors[0xd].
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::vector
                ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)local_8f0)
      ;
      local_8f0 = local_8f0 + 3;
    } while (local_8f0 !=
             &inVectors[0xd].
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_908 = &uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::vector
                ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)local_908)
      ;
      local_908 = local_908 + 3;
    } while (local_908 !=
             &outVectors[0xd].
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::vector
              ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)local_500);
    (*resolver->_vptr_TIoMapResolver[0xe])(resolver,0xe);
    for (local_504 = EShLangVertex; (int)local_504 < 0xe; local_504 = local_504 + EShLangTessControl
        ) {
      if (this->inVarMaps[(int)local_504] != (TVarLiveMap *)0x0) {
        TResolverInOutAdaptor::setStage((TResolverInOutAdaptor *)&symbolValidater.profile,local_504)
        ;
        iVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                ::begin(this->inVarMaps[(int)local_504]);
        iVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                ::end(this->inVarMaps[(int)local_504]);
        __f_00.stage = local_504;
        __f_00.inVectors =
             (TVarLiveVector (*) [14])
             &outVectors[0xd].
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
        __f_00._12_4_ = 0;
        std::
        for_each<std::_Rb_tree_iterator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TVarEntryInfo>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__0>
                  ((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                    )iVar4._M_node,
                   (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                    )iVar5._M_node,__f_00);
        iVar6 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVectors[(long)(int)local_504 + 0xd].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar7 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVectors[(long)(int)local_504 + 0xd].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>
                  (iVar6._M_current,iVar7._M_current);
        iVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                ::begin(this->outVarMaps[(int)local_504]);
        iVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                ::end(this->outVarMaps[(int)local_504]);
        __f_01.stage = local_504;
        __f_01.outVectors =
             (TVarLiveVector (*) [14])
             &uniformVector.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
        __f_01._12_4_ = 0;
        std::
        for_each<std::_Rb_tree_iterator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TVarEntryInfo>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__2>
                  ((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                    )iVar4._M_node,
                   (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                    )iVar5._M_node,__f_01);
        iVar6 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVectors[(long)(int)local_504 + -1].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar7 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVectors[(long)(int)local_504 + -1].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>
                  (iVar6._M_current,iVar7._M_current);
        ppTVar8 = &outVectors[(long)(int)local_504 + 0xd].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end4 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                           ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *
                            )ppTVar8);
        var = (TVarLivePair *)
              std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                        ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                         ppTVar8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                                           *)&var), bVar1) {
          ppVar9 = &__gnu_cxx::
                    __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    ::operator*(&__end4)->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          TSymbolValidater::operator()
                    ((TSymbolValidater *)
                     &inVectors[0xd].
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar9);
          __gnu_cxx::
          __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
          ::operator++(&__end4);
        }
        ppTVar8 = &outVectors[(long)(int)local_504 + 0xd].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end4_1 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                             ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                               *)ppTVar8);
        var_1 = (TVarLivePair *)
                std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           ppTVar8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                                   *)&var_1), bVar1) {
          ppVar9 = &__gnu_cxx::
                    __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    ::operator*(&__end4_1)->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          TResolverInOutAdaptor::operator()
                    ((TResolverInOutAdaptor *)&symbolValidater.profile,ppVar9);
          __gnu_cxx::
          __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
          ::operator++(&__end4_1);
        }
        ppTVar8 = &outVectors[(long)(int)local_504 + -1].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end4_2 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                             ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                               *)ppTVar8);
        var_2 = (TVarLivePair *)
                std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           ppTVar8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_2,
                                  (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                                   *)&var_2), bVar1) {
          ppVar9 = &__gnu_cxx::
                    __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    ::operator*(&__end4_2)->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          TSymbolValidater::operator()
                    ((TSymbolValidater *)
                     &inVectors[0xd].
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar9);
          __gnu_cxx::
          __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
          ::operator++(&__end4_2);
        }
        ppTVar8 = &outVectors[(long)(int)local_504 + -1].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end4_3 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                             ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                               *)ppTVar8);
        var_3 = (TVarLivePair *)
                std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           ppTVar8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_3,
                                  (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                                   *)&var_3), bVar1) {
          ppVar9 = &__gnu_cxx::
                    __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    ::operator*(&__end4_3)->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          TResolverInOutAdaptor::operator()
                    ((TResolverInOutAdaptor *)&symbolValidater.profile,ppVar9);
          __gnu_cxx::
          __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
          ::operator++(&__end4_3);
        }
        iVar6 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVectors[(long)(int)local_504 + 0xd].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar7 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVectors[(long)(int)local_504 + 0xd].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __f_02.stage = local_504;
        __f_02.this = this;
        __f_02._12_4_ = 0;
        std::
        for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__4>
                  ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar6._M_current,
                   (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar7._M_current,__f_02);
        iVar6 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVectors[(long)(int)local_504 + -1].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar7 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVectors[(long)(int)local_504 + -1].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __f_03.stage = local_504;
        __f_03.this = this;
        __f_03._12_4_ = 0;
        std::
        for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__5>
                  ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar6._M_current,
                   (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar7._M_current,__f_03);
      }
      if (this->uniformVarMap[(int)local_504] != (TVarLiveMap *)0x0) {
        TResolverUniformAdaptor::setStage((TResolverUniformAdaptor *)&inOutResolve.error,local_504);
        this_00 = this->uniformVarMap[(int)local_504];
        __end4_4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::begin(this_00);
        var_4 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::end(this_00);
        while (bVar1 = std::operator!=(&__end4_4,(_Self *)&var_4), bVar1) {
          local_698 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                      ::operator*(&__end4_4);
          TVarLivePair::TVarLivePair(&local_6f0,local_698);
          std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::push_back
                    ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                     local_500,&local_6f0);
          TVarLivePair::~TVarLivePair(&local_6f0);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
          ::operator++(&__end4_4);
        }
      }
    }
    iVar6 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       local_500);
    iVar7 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       local_500);
    std::
    sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>
              (iVar6._M_current,iVar7._M_current);
    __end2 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                       ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                        local_500);
    var_5 = (TVarLivePair *)
            std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       local_500);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                                       *)&var_5), bVar1) {
      ppVar9 = &__gnu_cxx::
                __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                ::operator*(&__end2)->
                super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
      ;
      TSymbolValidater::operator()
                ((TSymbolValidater *)
                 &inVectors[0xd].
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,ppVar9);
      __gnu_cxx::
      __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                         ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                          local_500);
    var_6 = (TVarLivePair *)
            std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       local_500);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                               *)&var_6), bVar1) {
      ppVar9 = &__gnu_cxx::
                __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                ::operator*(&__end2_1)->
                super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
      ;
      TResolverUniformAdaptor::operator()((TResolverUniformAdaptor *)&inOutResolve.error,ppVar9);
      __gnu_cxx::
      __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
      ::operator++(&__end2_1);
    }
    iVar6 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       local_500);
    iVar7 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       local_500);
    std::
    sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>
              (iVar6._M_current,iVar7._M_current);
    (*resolver->_vptr_TIoMapResolver[0xf])(resolver,0xe);
    sVar10 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::length
                       (&this->autoPushConstantBlockName);
    if (sVar10 != 0) {
      bVar1 = false;
      for (pUniformVarMap = (TVarLiveMap **)0x0; pUniformVarMap < (TVarLiveMap **)0xe;
          pUniformVarMap = (TVarLiveMap **)((long)pUniformVarMap + 1)) {
        if (this->intermediates[(long)pUniformVarMap] != (TIntermediate *)0x0) {
          at._M_node = (_Base_ptr)&uniformResolve.error;
          local_778._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               ::find(*(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                        **)((long)at._M_node + pUniformVarMap * 8),&this->autoPushConstantBlockName)
          ;
          qualifier = (TQualifier *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                      ::end(*(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                              **)(&(at._M_node)->_M_color + (long)pUniformVarMap * 2));
          bVar2 = std::operator==(&local_778,(_Self *)&qualifier);
          if (!bVar2) {
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                      ::operator->(&local_778);
            iVar3 = (*(((ppVar11->second).symbol)->super_TIntermTyped).super_TIntermNode.
                      _vptr_TIntermNode[0x21])();
            t = (TType *)CONCAT44(extraout_var,iVar3);
            bVar2 = TQualifier::isUniform((TQualifier *)t);
            if (bVar2) {
              ppVar11 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                        ::operator->(&local_778);
              iVar3 = (*(((ppVar11->second).symbol)->super_TIntermTyped).super_TIntermNode.
                        _vptr_TIntermNode[0x1f])();
              _stride = (TType *)CONCAT44(extraout_var_00,iVar3);
              TIntermediate::getBaseAlignment
                        (_stride,&local_794,&local_798,this->autoPushConstantBlockPacking,
                         (uint)((ulong)*(undefined8 *)&t->field_0x8 >> 0x3d) == 1);
              if (local_794 <= (int)this->autoPushConstantMaxSize) {
                TQualifier::setBlockStorage((TQualifier *)t,EbsPushConstant);
                *(byte *)&(t->qualifier).semanticName =
                     *(byte *)&(t->qualifier).semanticName & 0xf0 |
                     (byte)this->autoPushConstantBlockPacking & 0xf;
                *(ulong *)&(t->qualifier).field_0xc =
                     *(ulong *)&(t->qualifier).field_0xc & 0xffffffffffc07fff | 0x1f8000;
                ppVar11 = std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                          ::operator->(&local_778);
                TVarEntryInfo::clearNewAssignments(&ppVar11->second);
                bVar1 = true;
              }
            }
          }
        }
      }
      if (bVar1) {
        iVar6 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           local_500);
        iVar7 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           local_500);
        std::
        for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__8>
                  ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar6._M_current,
                   (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar7._M_current,(anon_class_8_1_8991fb9c)this);
      }
    }
    for (pUniformVarMap_1 = (TVarLiveMap **)0x0; pUniformVarMap_1 < (TVarLiveMap **)0xe;
        pUniformVarMap_1 = (TVarLiveMap **)((long)pUniformVarMap_1 + 1)) {
      if (this->intermediates[(long)pUniformVarMap_1] != (TIntermediate *)0x0) {
        iVar6 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           local_500);
        iVar7 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           local_500);
        __f.stage = (size_t)pUniformVarMap_1;
        __f.pUniformVarMap = (TVarLiveMap **)&uniformResolve.error;
        join_0x00000010_0x00000000_ =
             std::
             for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__9>
                       ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                         )iVar6._M_current,
                        (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                         )iVar7._M_current,__f);
        TVarSetTraverser::TVarSetTraverser
                  ((TVarSetTraverser *)local_8e0,this->intermediates[(long)pUniformVarMap_1],
                   this->inVarMaps[(long)pUniformVarMap_1],this->outVarMaps[(long)pUniformVarMap_1],
                   uniformResolve.uniformVarMap[(long)pUniformVarMap_1 + -1]);
        pTVar12 = TIntermediate::getTreeRoot(this->intermediates[(long)pUniformVarMap_1]);
        (*pTVar12->_vptr_TIntermNode[2])(pTVar12,local_8e0);
        TVarSetTraverser::~TVarSetTraverser((TVarSetTraverser *)local_8e0);
      }
    }
    this_local._7_1_ = (bool)((this->hadError ^ 0xffU) & 1);
    std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::~vector
              ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)local_500);
    local_920 = &outVectors[0xd].
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_920 = local_920 + -3;
      std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::~vector
                ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)local_920)
      ;
    } while (local_920 !=
             &uniformVector.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_938 = &inVectors[0xd].
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_938 = local_938 + -3;
      std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::~vector
                ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)local_938)
      ;
    } while (local_938 !=
             &outVectors[0xd].
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TGlslIoMapper::doMap(TIoMapResolver* resolver, TInfoSink& infoSink) {
    resolver->endResolve(EShLangCount);
    if (!hadError) {
        //Resolve uniform location, ubo/ssbo/opaque bindings across stages
        TResolverUniformAdaptor uniformResolve(EShLangCount, *resolver, uniformVarMap, infoSink, hadError);
        TResolverInOutAdaptor inOutResolve(EShLangCount, *resolver, infoSink, hadError);
        TSymbolValidater symbolValidater(*resolver, infoSink, inVarMaps,
                                         outVarMaps, uniformVarMap, hadError, profile, version);

        TVarLiveVector inVectors[EShLangCount];
        TVarLiveVector outVectors[EShLangCount];
        TVarLiveVector uniformVector;

        resolver->beginResolve(EShLangCount);
        for (int stage = EShLangVertex; stage < EShLangCount; stage++) {
            if (inVarMaps[stage] != nullptr) {
                inOutResolve.setStage(EShLanguage(stage));

                // copy vars into a sorted list
                std::for_each(inVarMaps[stage]->begin(), inVarMaps[stage]->end(),
                        [&inVectors, stage](TVarLivePair p) { inVectors[stage].push_back(p); });
                std::sort(inVectors[stage].begin(), inVectors[stage].end(),
                        [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
                            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
                });

                std::for_each(outVarMaps[stage]->begin(), outVarMaps[stage]->end(),
                        [&outVectors, stage](TVarLivePair p) { outVectors[stage].push_back(p); });
                std::sort(outVectors[stage].begin(), outVectors[stage].end(),
                        [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
                            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
                });

                for (auto& var : inVectors[stage]) { symbolValidater(var); }
                for (auto& var : inVectors[stage]) { inOutResolve(var); }
                for (auto& var : outVectors[stage]) { symbolValidater(var); }
                for (auto& var : outVectors[stage]) { inOutResolve(var); }

                // copy results back into maps
                std::for_each(inVectors[stage].begin(), inVectors[stage].end(),
                    [this, stage](TVarLivePair p) {
                        auto at = inVarMaps[stage]->find(p.first);
                        if (at != inVarMaps[stage]->end())
                            at->second = p.second;
                });

                std::for_each(outVectors[stage].begin(), outVectors[stage].end(),
                    [this, stage](TVarLivePair p) {
                        auto at = outVarMaps[stage]->find(p.first);
                        if (at != outVarMaps[stage]->end())
                            at->second = p.second;
                });

            }
            if (uniformVarMap[stage] != nullptr) {
                uniformResolve.setStage(EShLanguage(stage));
                for (auto& var : *(uniformVarMap[stage])) { uniformVector.push_back(var); }
            }
        }
        std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
            return TVarEntryInfo::TOrderByPriorityAndLive()(p1.second, p2.second);
        });
        for (auto& var : uniformVector) { symbolValidater(var); }
        for (auto& var : uniformVector) { uniformResolve(var); }
        std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
        });
        resolver->endResolve(EShLangCount);
        if (autoPushConstantBlockName.length()) {
            bool upgraded = false;
            for (size_t stage = 0; stage < EShLangCount; stage++) {
                if (intermediates[stage] != nullptr) {
                    TVarLiveMap** pUniformVarMap = uniformResolve.uniformVarMap;
                    auto at = pUniformVarMap[stage]->find(autoPushConstantBlockName);
                    if (at == pUniformVarMap[stage]->end())
                        continue;
                    TQualifier& qualifier = at->second.symbol->getQualifier();
                    if (!qualifier.isUniform())
                        continue;
                    TType& t = at->second.symbol->getWritableType();
                    int size, stride;
                    TIntermediate::getBaseAlignment(t, size, stride, autoPushConstantBlockPacking,
                                                    qualifier.layoutMatrix == ElmRowMajor);
                    if (size <= int(autoPushConstantMaxSize)) {
                        qualifier.setBlockStorage(EbsPushConstant);
                        qualifier.layoutPacking = autoPushConstantBlockPacking;
                        // Push constants don't have set/binding etc. decorations, remove those.
                        qualifier.layoutSet = TQualifier::layoutSetEnd;
                        at->second.clearNewAssignments();

                        upgraded = true;
                    }
                }
            }
            // If it's been upgraded to push_constant, then set the flag so when its traversed
            // in the next for loop, all references to this symbol will get their flag changed.
            // so it doesn't get a set/binding assigned to it.
            if (upgraded) {
                std::for_each(uniformVector.begin(), uniformVector.end(),
                                       [this](TVarLivePair& p) {
                if (p.first == autoPushConstantBlockName) {
                        p.second.upgradedToPushConstantPacking = autoPushConstantBlockPacking;
                        p.second.newSet = TQualifier::layoutSetEnd;
                    }
                });
            }
        }
        for (size_t stage = 0; stage < EShLangCount; stage++) {
            if (intermediates[stage] != nullptr) {
                // traverse each stage, set new location to each input/output and unifom symbol, set new binding to
                // ubo, ssbo and opaque symbols. Assign push_constant upgrades as well.
                TVarLiveMap** pUniformVarMap = uniformResolve.uniformVarMap;
                std::for_each(uniformVector.begin(), uniformVector.end(), [pUniformVarMap, stage](TVarLivePair p) {
                    auto at = pUniformVarMap[stage]->find(p.second.symbol->getAccessName());
                    if (at != pUniformVarMap[stage]->end() && at->second.id == p.second.id){
                        if (p.second.upgradedToPushConstantPacking != ElpNone) {
                            at->second.upgradedToPushConstantPacking = p.second.upgradedToPushConstantPacking;
                        } else {
                            int resolvedBinding = at->second.newBinding;
                            at->second = p.second;
                            if (resolvedBinding > 0)
                                at->second.newBinding = resolvedBinding;
                        }
                    }
                });
                TVarSetTraverser iter_iomap(*intermediates[stage], *inVarMaps[stage], *outVarMaps[stage],
                                            *uniformResolve.uniformVarMap[stage]);
                intermediates[stage]->getTreeRoot()->traverse(&iter_iomap);
            }
        }
        return !hadError;
    } else {
        return false;
    }
}